

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetSpecsOf.hpp
# Opt level: O2

void __thiscall
sciplot::OffsetSpecsOf<sciplot::TicsSpecs>::OffsetSpecsOf
          (OffsetSpecsOf<sciplot::TicsSpecs> *this,void **vtt)

{
  void *pvVar1;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x28)) = vtt[1];
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->xoffset,"0",&local_19);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->yoffset,"0",&local_1a);
  return;
}

Assistant:

OffsetSpecsOf<DerivedSpecs>::OffsetSpecsOf()
{
}